

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# trico.c
# Opt level: O0

int read_inplace(void *buf,uint64_t element_size,uint64_t element_count,trico_archive *arch)

{
  uint64_t data_read;
  uint64_t sz;
  trico_archive *arch_local;
  uint64_t element_count_local;
  uint64_t element_size_local;
  void *buf_local;
  
  if (arch->writable == 0) {
    if ((uint8_t *)arch->data_size <
        arch->data_pointer + (element_size * element_count - (long)arch->data)) {
      buf_local._4_4_ = 0;
    }
    else {
      memcpy(buf,arch->data_pointer,element_size * element_count);
      buf_local._4_4_ = 1;
    }
  }
  else {
    buf_local._4_4_ = 0;
  }
  return buf_local._4_4_;
}

Assistant:

static int read_inplace(void* buf, uint64_t element_size, uint64_t element_count, struct trico_archive* arch)
  {
  if (arch->writable)
    return 0;
  uint64_t sz = element_size * element_count;
  uint64_t data_read = arch->data_pointer - arch->data;
  if ((data_read + sz) > arch->data_size)
    return 0;
  memcpy(buf, arch->data_pointer, sz);
  return 1;
  }